

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_detection.cpp
# Opt level: O2

bool anon_unknown.dwarf_6e813::findPoint<float>
               (vector<int,_std::allocator<int>_> *data,vector<int,_std::allocator<int>_> *second,
               vector<float,_std::allocator<float>_> *edge,uint32_t leftSideOffset,
               uint32_t rightSideOffset,int minimumContrast,bool checkContrast,
               uint32_t leftSideContrastCheck,uint32_t rightSideContrastCheck,uint32_t position,
               uint32_t size)

{
  int iVar1;
  pointer piVar2;
  bool bVar3;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var4;
  int iVar5;
  ulong uVar6;
  float *__args;
  uint32_t blackContrastEnd;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar10 [16];
  undefined1 in_ZMM3 [64];
  undefined4 in_XMM4_Da;
  undefined1 in_register_00001304 [12];
  float local_38;
  float local_34;
  
  auVar10 = in_ZMM3._0_16_;
  auVar9 = in_ZMM1._0_16_;
  piVar2 = (data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  _Var4 = std::
          __max_element<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (piVar2 + leftSideOffset,piVar2 + (ulong)rightSideOffset + 1);
  piVar2 = (data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  iVar1 = *_Var4._M_current;
  _Var4 = std::
          __min_element<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (piVar2 + leftSideOffset,piVar2 + (ulong)rightSideOffset + 1);
  if (iVar1 - *_Var4._M_current < minimumContrast) {
LAB_001162c0:
    bVar3 = false;
  }
  else {
    if ((checkContrast && leftSideContrastCheck <= position) &&
       (position + rightSideContrastCheck < size)) {
      piVar2 = (data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start;
      uVar6 = (ulong)(position + 1);
      fVar7 = std::
              accumulate<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,float>
                        ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                         (piVar2 + (position - leftSideContrastCheck)),
                         (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                         (piVar2 + (ulong)position + 1),0.0);
      piVar2 = (data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start;
      fVar8 = std::
              accumulate<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,float>
                        ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                         (piVar2 + uVar6),
                         (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                         (piVar2 + (ulong)(position + rightSideContrastCheck) + 1),0.0);
      auVar9 = vcvtusi2ss_avx512f(auVar9,leftSideContrastCheck + 1);
      auVar10 = vcvtusi2ss_avx512f(auVar10,rightSideContrastCheck);
      if (fVar8 / auVar10._0_4_ - fVar7 / auVar9._0_4_ < (float)minimumContrast) goto LAB_001162c0;
    }
    else {
      if (checkContrast) goto LAB_001162c0;
      uVar6 = (ulong)(position + 1);
    }
    piVar2 = (second->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    auVar9._4_12_ = in_register_00001304;
    auVar9._0_4_ = in_XMM4_Da;
    auVar9 = vcvtusi2ss_avx512f(auVar9,position);
    iVar1 = piVar2[position];
    iVar5 = iVar1 - piVar2[uVar6];
    if (iVar5 == 0) {
      fVar7 = auVar9._0_4_ + 0.5;
      __args = &local_38;
    }
    else {
      __args = &local_34;
      fVar7 = (float)iVar1 / (float)iVar5 + auVar9._0_4_;
    }
    *__args = fVar7;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(edge,__args);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool findPoint( const std::vector< int > & data, const std::vector< int > & second, std::vector< _Type > & edge,
                    uint32_t leftSideOffset, uint32_t rightSideOffset, int minimumContrast, bool checkContrast,
                    uint32_t leftSideContrastCheck, uint32_t rightSideContrastCheck, uint32_t position, uint32_t size )
    {
        const int maxIntensity = *(std::max_element( data.begin() + leftSideOffset, data.begin() + rightSideOffset + 1 ));
        const int minIntensity = *(std::min_element( data.begin() + leftSideOffset, data.begin() + rightSideOffset + 1 ));

        if ( maxIntensity - minIntensity < minimumContrast )
            return false;

        if ( checkContrast && leftSideContrastCheck <= position && (rightSideContrastCheck + position) < size ) {
            const uint32_t blackContrastEnd   = position;
            const uint32_t whiteContrastStart = position + 1;

            const uint32_t blackContrastStart = position - leftSideContrastCheck;
            const uint32_t whiteContrastEnd   = position + rightSideContrastCheck;

            _Type sumBlack = std::accumulate( data.begin() + blackContrastStart, data.begin() + blackContrastEnd + 1, 0.0f );
            _Type sumWhite = std::accumulate( data.begin() + whiteContrastStart, data.begin() + whiteContrastEnd + 1, 0.0f );

            sumBlack /= (blackContrastEnd - blackContrastStart + 1);
            sumWhite /= (whiteContrastEnd - whiteContrastStart + 1);

            if ( sumWhite - sumBlack >= minimumContrast )
                checkContrast = false;
        }

        if ( !checkContrast ) {
            if ( second[position] != second[position + 1] )
                edge.push_back( position + static_cast<_Type>(second[position]) / (second[position] - second[position + 1u]) );
            else
                edge.push_back( position + 0.5f );
            return true;
        }

        return false;
    }